

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfPxr24Compressor.cpp
# Opt level: O2

int __thiscall
Imf_2_5::Pxr24Compressor::compress
          (Pxr24Compressor *this,char *inPtr,int inSize,Box2i *range,char **outPtr)

{
  uchar *puVar1;
  ushort uVar2;
  _Rb_tree_color _Var3;
  int iVar4;
  const_iterator cVar5;
  ConstIterator CVar6;
  long lVar7;
  BaseExc *this_00;
  uchar *puVar8;
  uchar *puVar9;
  uchar *puVar10;
  int iVar11;
  uint uVar12;
  uchar *puVar13;
  int iVar14;
  uint uVar15;
  size_t k;
  long lVar16;
  int iVar17;
  anon_union_4_2_947300a4 u;
  double dVar18;
  uLongf outSize;
  int local_54;
  int local_50;
  int local_4c;
  Pxr24Compressor *local_48;
  char **local_40;
  uchar *local_38;
  
  if (inSize == 0) {
    *outPtr = this->_outBuffer;
    outSize._0_4_ = 0;
  }
  else {
    local_4c = (range->min).x;
    iVar17 = (range->min).y;
    local_50 = (range->max).x;
    if (this->_maxX < local_50) {
      local_50 = this->_maxX;
    }
    local_54 = (range->max).y;
    if (this->_maxY < local_54) {
      local_54 = this->_maxY;
    }
    puVar9 = this->_tmpBuffer;
    local_48 = this;
    local_40 = outPtr;
    for (; iVar17 <= local_54; iVar17 = iVar17 + 1) {
      for (cVar5._M_node = (_Base_ptr)ChannelList::begin(this->_channels);
          CVar6 = ChannelList::end(this->_channels),
          (const_iterator)cVar5._M_node != CVar6._i._M_node;
          cVar5._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar5._M_node)) {
        iVar4 = Imath_2_5::modp(iVar17,*(int *)&cVar5._M_node[9]._M_parent);
        if (iVar4 == 0) {
          iVar4 = numSamples(*(int *)&cVar5._M_node[9].field_0x4,local_4c,local_50);
          _Var3 = cVar5._M_node[9]._M_color;
          lVar7 = (long)iVar4;
          if (_Var3 == 2) {
            puVar8 = puVar9 + lVar7;
            puVar10 = puVar8 + lVar7;
            iVar11 = 0;
            if (0 < iVar4) {
              iVar11 = iVar4;
            }
            local_38 = puVar10;
            uVar12 = 0;
            for (iVar4 = 0; puVar1 = local_38, iVar4 != iVar11; iVar4 = iVar4 + 1) {
              for (lVar16 = 0; lVar16 != 4; lVar16 = lVar16 + 1) {
                *(undefined1 *)((long)&outSize + lVar16) = *(undefined1 *)((long)inPtr + lVar16);
              }
              if ((~(uint)outSize & 0x7f800000) == 0) {
                if ((outSize & 0x7fffff) == 0) {
                  uVar15 = 0x7f8000;
                }
                else {
                  uVar15 = (uint)(((uint)outSize & 0x7fffff) < 0x100) |
                           ((uint)outSize & 0x7fffff) >> 8 | 0x7f8000;
                }
              }
              else {
                uVar15 = ((uint)outSize & 0x80) + ((uint)outSize & 0x7fffffff);
                if (0x7f7fffff < uVar15) {
                  uVar15 = (uint)outSize & 0x7fffffff;
                }
                uVar15 = uVar15 >> 8;
              }
              inPtr = (char *)((long)inPtr + 4);
              uVar15 = (uint)outSize >> 8 & 0x800000 | uVar15;
              iVar14 = uVar15 - uVar12;
              *puVar9 = (uchar)((uint)iVar14 >> 0x10);
              puVar9 = puVar9 + 1;
              *puVar8 = (uchar)((uint)iVar14 >> 8);
              puVar8 = puVar8 + 1;
              *puVar10 = (uchar)iVar14;
              puVar10 = puVar10 + 1;
              uVar12 = uVar15;
            }
LAB_0054f569:
            puVar9 = puVar1 + lVar7;
            this = local_48;
          }
          else if (_Var3 == _S_black) {
            lVar16 = 0;
            iVar11 = 0;
            if (0 < iVar4) {
              iVar11 = iVar4;
            }
            uVar12 = 0;
            for (; iVar11 != (int)lVar16; lVar16 = lVar16 + 1) {
              uVar2 = *(ushort *)inPtr;
              inPtr = (char *)((long)inPtr + 2);
              iVar4 = uVar2 - uVar12;
              puVar9[lVar16] = (uchar)((uint)iVar4 >> 8);
              puVar9[lVar16 + lVar7] = (uchar)iVar4;
              uVar12 = (uint)uVar2;
            }
            puVar9 = puVar9 + lVar7 * 2;
          }
          else if (_Var3 == _S_red) {
            puVar8 = puVar9 + lVar7;
            puVar10 = puVar8 + lVar7;
            puVar1 = puVar10 + lVar7;
            iVar11 = 0;
            if (0 < iVar4) {
              iVar11 = iVar4;
            }
            puVar13 = puVar1;
            iVar4 = 0;
            for (iVar14 = 0; iVar14 != iVar11; iVar14 = iVar14 + 1) {
              for (lVar16 = 0; lVar16 != 4; lVar16 = lVar16 + 1) {
                *(undefined1 *)((long)&outSize + lVar16) = *(undefined1 *)((long)inPtr + lVar16);
              }
              iVar4 = (uint)outSize - iVar4;
              *puVar9 = (uchar)((uint)iVar4 >> 0x18);
              puVar9 = puVar9 + 1;
              *puVar8 = (uchar)((uint)iVar4 >> 0x10);
              puVar8 = puVar8 + 1;
              *puVar10 = (uchar)((uint)iVar4 >> 8);
              puVar10 = puVar10 + 1;
              *puVar13 = (uchar)iVar4;
              puVar13 = puVar13 + 1;
              inPtr = (char *)((long)inPtr + 4);
              iVar4 = (uint)outSize;
            }
            goto LAB_0054f569;
          }
        }
      }
    }
    puVar8 = this->_tmpBuffer;
    lVar7 = (long)puVar9 - (long)puVar8;
    dVar18 = ceil((double)lVar7 * 1.01);
    outSize = (uLongf)((int)dVar18 + 100);
    iVar17 = ::compress(this->_outBuffer,&outSize,puVar8,lVar7);
    if (iVar17 != 0) {
      this_00 = (BaseExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::BaseExc::BaseExc(this_00,"Data compression (zlib) failed.");
      __cxa_throw(this_00,&Iex_2_5::BaseExc::typeinfo,Iex_2_5::BaseExc::~BaseExc);
    }
    *local_40 = this->_outBuffer;
  }
  return (uint)outSize;
}

Assistant:

int
Pxr24Compressor::compress (const char *inPtr,
			   int inSize,
			   Box2i range,
			   const char *&outPtr)
{
    if (inSize == 0)
    {
	outPtr = _outBuffer;
	return 0;
    }

    int minX = range.min.x;
    int maxX = min (range.max.x, _maxX);
    int minY = range.min.y;
    int maxY = min (range.max.y, _maxY);

    unsigned char *tmpBufferEnd = _tmpBuffer;

    for (int y = minY; y <= maxY; ++y)
    {
	for (ChannelList::ConstIterator i = _channels.begin();
	     i != _channels.end();
	     ++i)
	{
	    const Channel &c = i.channel();

	    if (modp (y, c.ySampling) != 0)
		continue;

	    int n = numSamples (c.xSampling, minX, maxX);

	    unsigned char *ptr[4];
	    unsigned int previousPixel = 0;

	    switch (c.type)
	    {
	      case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

		ptr[0] = tmpBufferEnd;
		ptr[1] = ptr[0] + n;
		ptr[2] = ptr[1] + n;
		ptr[3] = ptr[2] + n;
		tmpBufferEnd = ptr[3] + n;

		for (int j = 0; j < n; ++j)
		{
		    unsigned int pixel;
		    char *pPtr = (char *) &pixel;

		    for (size_t k = 0; k < sizeof (pixel); ++k)
			*pPtr++ = *inPtr++;

		    unsigned int diff = pixel - previousPixel;
		    previousPixel = pixel;

		    *(ptr[0]++) = diff >> 24;
		    *(ptr[1]++) = diff >> 16;
		    *(ptr[2]++) = diff >> 8;
		    *(ptr[3]++) = diff;
		}

		break;

	      case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

		ptr[0] = tmpBufferEnd;
		ptr[1] = ptr[0] + n;
		tmpBufferEnd = ptr[1] + n;

		for (int j = 0; j < n; ++j)
		{
		    half pixel;

		    pixel = *(const half *) inPtr;
		    inPtr += sizeof (half);

		    unsigned int diff = pixel.bits() - previousPixel;
		    previousPixel = pixel.bits();

		    *(ptr[0]++) = diff >> 8;
		    *(ptr[1]++) = diff;
		}

		break;

	      case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

		ptr[0] = tmpBufferEnd;
		ptr[1] = ptr[0] + n;
		ptr[2] = ptr[1] + n;
		tmpBufferEnd = ptr[2] + n;

		for (int j = 0; j < n; ++j)
		{
		    float pixel;
		    char *pPtr = (char *) &pixel;

		    for (size_t k = 0; k < sizeof (pixel); ++k)
			*pPtr++ = *inPtr++;

		    unsigned int pixel24 = floatToFloat24 (pixel);
		    unsigned int diff = pixel24 - previousPixel;
		    previousPixel = pixel24;

		    *(ptr[0]++) = diff >> 16;
		    *(ptr[1]++) = diff >> 8;
		    *(ptr[2]++) = diff;
		}

		break;

	      default:

		assert (false);
	    }
	}
    }

    uLongf outSize = int (ceil ((tmpBufferEnd - _tmpBuffer) * 1.01)) + 100;

    if (Z_OK != ::compress ((Bytef *) _outBuffer,
			    &outSize,
			    (const Bytef *) _tmpBuffer,
			    tmpBufferEnd - _tmpBuffer))
    {
	throw IEX_NAMESPACE::BaseExc ("Data compression (zlib) failed.");
    }

    outPtr = _outBuffer;
    return outSize;
}